

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void whereInfoFree(sqlite3 *db,WhereInfo *pWInfo)

{
  WhereLoop *p_00;
  ulong uVar1;
  WhereLoop *p;
  WhereLoop **ppWVar2;
  
  if (pWInfo->nLevel != '\0') {
    ppWVar2 = &pWInfo->a[0].pWLoop;
    uVar1 = 0;
    do {
      if (((*ppWVar2 != (WhereLoop *)0x0) && (((*ppWVar2)->wsFlags & 0x800) != 0)) &&
         (ppWVar2[-1] != (WhereLoop *)0x0)) {
        sqlite3DbFreeNN(db,ppWVar2[-1]);
      }
      uVar1 = uVar1 + 1;
      ppWVar2 = ppWVar2 + 0xb;
    } while (uVar1 < pWInfo->nLevel);
  }
  sqlite3WhereClauseClear(&pWInfo->sWC);
  while (p_00 = pWInfo->pLoops, p_00 != (WhereLoop *)0x0) {
    pWInfo->pLoops = p_00->pNextLoop;
    whereLoopClear(db,p_00);
    sqlite3DbFreeNN(db,p_00);
  }
  sqlite3DbFreeNN(db,pWInfo);
  return;
}

Assistant:

static void whereInfoFree(sqlite3 *db, WhereInfo *pWInfo){
  int i;
  assert( pWInfo!=0 );
  for(i=0; i<pWInfo->nLevel; i++){
    WhereLevel *pLevel = &pWInfo->a[i];
    if( pLevel->pWLoop && (pLevel->pWLoop->wsFlags & WHERE_IN_ABLE) ){
      sqlite3DbFree(db, pLevel->u.in.aInLoop);
    }
  }
  sqlite3WhereClauseClear(&pWInfo->sWC);
  while( pWInfo->pLoops ){
    WhereLoop *p = pWInfo->pLoops;
    pWInfo->pLoops = p->pNextLoop;
    whereLoopDelete(db, p);
  }
  sqlite3DbFreeNN(db, pWInfo);
}